

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weighted_graph_adj_set.h
# Opt level: O2

void __thiscall
data_structures::WeightedGraphAdjSet<int,_int>::WeightedGraphAdjSet
          (WeightedGraphAdjSet<int,_int> *this,Node *v)

{
  SymbolTable<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>
  local_40;
  
  this->_vptr_WeightedGraphAdjSet = (_func_int **)&PTR__WeightedGraphAdjSet_0010b988;
  SymbolTable<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>
  ::SymbolTable(&this->_table);
  this->_vertex = v;
  SymbolTable<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>
  ::SymbolTable(&local_40);
  LinkedList<data_structures::SymbolTableElement<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>_>
  ::operator=(&(this->_table)._list,&local_40._list);
  SymbolTable<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>_*,_data_structures::WeightedGraphEdge<data_structures::RBTreeNode<data_structures::TreeElement<int,_data_structures::WeightedGraphAdjSet<int,_int>_>_>,_int>_>
  ::~SymbolTable(&local_40);
  return;
}

Assistant:

inline
    WeightedGraphAdjSet<T, Weight>::WeightedGraphAdjSet(Node* v){
        _vertex = v;
        _table = SymbolTable<Node*, Edge>();
    }